

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

void __thiscall
OpenMD::StaticAnalyser::StaticAnalyser
          (StaticAnalyser *this,SimInfo *info,string *filename,uint nbins)

{
  undefined4 in_ECX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__StaticAnalyser_00560300;
  in_RDI[1] = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  *(undefined4 *)(in_RDI + 6) = 1;
  *(undefined4 *)((long)in_RDI + 0x34) = in_ECX;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  std::
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>::
  vector((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
          *)0x1ba8ca);
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::vector
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)0x1ba8da);
  return;
}

Assistant:

StaticAnalyser::StaticAnalyser(SimInfo* info, const std::string& filename,
                                 unsigned int nbins) :
      info_(info),
      dumpFilename_(filename), step_(1), nBins_(nbins) {}